

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateInfo.cpp
# Opt level: O1

int __thiscall helics::FederateInfo::checkIntProperty(FederateInfo *this,int propId,int defVal)

{
  pair<int,_int> *prop;
  pointer ppVar1;
  
  ppVar1 = (this->super_CoreFederateInfo).intProps.
           super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
           super__Vector_impl_data._M_start;
  while( true ) {
    if (ppVar1 == (this->super_CoreFederateInfo).intProps.
                  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                  _M_impl.super__Vector_impl_data._M_finish) {
      return defVal;
    }
    if (ppVar1->first == propId) break;
    ppVar1 = ppVar1 + 1;
  }
  return ppVar1->second;
}

Assistant:

int FederateInfo::checkIntProperty(int propId, int defVal) const
{
    for (const auto& prop : intProps) {
        if (prop.first == propId) {
            return prop.second;
        }
    }
    return defVal;
}